

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)

{
  __suseconds_t *p_Var1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  _func_void_bnode_ptr_bnode_ptr_idx_t_idx_t_idx_t *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  bnode *__ptr;
  bnode *__ptr_00;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  undefined8 auStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_32;
  char local_31 [7];
  uint8_t v_out;
  uint8_t v;
  
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = dummy_node('\b','\x01',1);
  __ptr->nentry = 10;
  local_31[0] = 'd';
  pcVar7 = (char *)(auStack_c0 + 3);
  for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
    pcVar8 = pcVar7 + -0x10;
    auStack_c0[uVar9 + 3] = pcVar8;
    pcVar7[-0x18] = -0x6b;
    pcVar7[-0x17] = '-';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sprintf(pcVar8,"key%d",uVar9 & 0xffffffff);
    p_Var2 = kv_ops->set_kv;
    pcVar7[-0x18] = -0x5a;
    pcVar7[-0x17] = '-';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    (*p_Var2)(__ptr,(idx_t)uVar9,pcVar8,local_31);
    local_31[0] = local_31[0] + '\x01';
    pcVar7 = pcVar8;
  }
  pcVar7[-8] = '\b';
  pcVar7[-7] = '\0';
  pcVar7[-6] = '\0';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  uVar4 = *(undefined8 *)(pcVar7 + -8);
  pcVar7[-8] = '\x01';
  pcVar7[-7] = '\0';
  pcVar7[-6] = '\0';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  uVar5 = *(undefined8 *)(pcVar7 + -8);
  pcVar7[-8] = -0x45;
  pcVar7[-7] = '-';
  pcVar7[-6] = '\x10';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  __ptr_00 = dummy_node((uint8_t)uVar4,(uint8_t)uVar5,(uint16_t)uVar5);
  pcVar7[-8] = '\x05';
  pcVar7[-7] = '\0';
  pcVar7[-6] = '\0';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  uVar4 = *(undefined8 *)(pcVar7 + -8);
  p_Var3 = kv_ops->copy_kv;
  pcVar7[-8] = -0x30;
  pcVar7[-7] = '-';
  pcVar7[-6] = '\x10';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  (*p_Var3)(__ptr_00,__ptr,0,(idx_t)uVar4,(idx_t)uVar4);
  local_31[0] = 'i';
  p_Var1 = &__test_begin.tv_usec;
  lVar10 = 0;
  do {
    if (lVar10 == 5) {
      pcVar7[-8] = '\x05';
      pcVar7[-7] = '\0';
      pcVar7[-6] = '\0';
      pcVar7[-5] = '\0';
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      uVar4 = *(undefined8 *)(pcVar7 + -8);
      pcVar7[-8] = '\n';
      pcVar7[-7] = '\0';
      pcVar7[-6] = '\0';
      pcVar7[-5] = '\0';
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      uVar5 = *(undefined8 *)(pcVar7 + -8);
      p_Var3 = kv_ops->copy_kv;
      pcVar7[-8] = -0x41;
      pcVar7[-7] = '.';
      pcVar7[-6] = '\x10';
      pcVar7[-5] = '\0';
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      (*p_Var3)(__ptr_00,__ptr,(idx_t)uVar4,0,(idx_t)uVar5);
      local_31[0] = 'd';
      p_Var1 = &__test_begin.tv_usec;
      lVar10 = 0;
      do {
        if (lVar10 == 10) {
          pcVar7[-8] = '\n';
          pcVar7[-7] = '\0';
          pcVar7[-6] = '\0';
          pcVar7[-5] = '\0';
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          uVar4 = *(undefined8 *)(pcVar7 + -8);
          p_Var3 = kv_ops->copy_kv;
          pcVar7[-8] = -0x4d;
          pcVar7[-7] = '/';
          pcVar7[-6] = '\x10';
          pcVar7[-5] = '\0';
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          (*p_Var3)(__ptr_00,__ptr,0,0,(idx_t)uVar4);
          local_31[0] = 'd';
          p_Var1 = &__test_begin.tv_usec;
          lVar10 = 0;
          do {
            if (lVar10 == 10) {
              pcVar7[-8] = -0x65;
              pcVar7[-7] = '0';
              pcVar7[-6] = '\x10';
              pcVar7[-5] = '\0';
              pcVar7[-4] = '\0';
              pcVar7[-3] = '\0';
              pcVar7[-2] = '\0';
              pcVar7[-1] = '\0';
              free(__ptr);
              pcVar7[-8] = -0x5d;
              pcVar7[-7] = '0';
              pcVar7[-6] = '\x10';
              pcVar7[-5] = '\0';
              pcVar7[-4] = '\0';
              pcVar7[-3] = '\0';
              pcVar7[-2] = '\0';
              pcVar7[-1] = '\0';
              free(__ptr_00);
              pcVar7[-8] = -0x58;
              pcVar7[-7] = '0';
              pcVar7[-6] = '\x10';
              pcVar7[-5] = '\0';
              pcVar7[-4] = '\0';
              pcVar7[-3] = '\0';
              pcVar7[-2] = '\0';
              pcVar7[-1] = '\0';
              memleak_end();
              pcVar8 = "%s PASSED\n";
              if (kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass != '\0') {
                pcVar8 = "%s FAILED\n";
              }
              pcVar7[-8] = -0x27;
              pcVar7[-7] = '0';
              pcVar7[-6] = '\x10';
              pcVar7[-5] = '\0';
              pcVar7[-4] = '\0';
              pcVar7[-3] = '\0';
              pcVar7[-2] = '\0';
              pcVar7[-1] = '\0';
              fprintf(_stderr,pcVar8,"kv_copy_var_nentry_test");
              return;
            }
            p_Var2 = kv_ops->get_kv;
            pcVar7[-8] = -0x28;
            pcVar7[-7] = '/';
            pcVar7[-6] = '\x10';
            pcVar7[-5] = '\0';
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            (*p_Var2)(__ptr_00,(idx_t)lVar10,p_Var1,&local_32);
            pcVar8 = (char *)auStack_c0[lVar10 + 3];
            pcVar7[-8] = -0x15;
            pcVar7[-7] = '/';
            pcVar7[-6] = '\x10';
            pcVar7[-5] = '\0';
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            iVar6 = strcmp((char *)p_Var1,pcVar8);
            if (iVar6 != 0) {
              builtin_strncpy(pcVar7 + -8,"%0\x10",4);
              pcVar7[-4] = '\0';
              pcVar7[-3] = '\0';
              pcVar7[-2] = '\0';
              pcVar7[-1] = '\0';
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x2a9);
              kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
              builtin_strncpy(pcVar7 + -8,"70\x10",4);
              pcVar7[-4] = '\0';
              pcVar7[-3] = '\0';
              pcVar7[-2] = '\0';
              pcVar7[-1] = '\0';
              iVar6 = strcmp((char *)p_Var1,pcVar8);
              if (iVar6 != 0) {
                *(code **)(pcVar7 + -8) = kv_get_nth_idx_test;
                __assert_fail("!(strcmp(k_out, key[idx]))",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0x2a9,"void kv_copy_var_nentry_test(btree_kv_ops *)");
              }
            }
            if (local_32 != local_31[0]) {
              builtin_strncpy(pcVar7 + -8,"d0\x10",4);
              pcVar7[-4] = '\0';
              pcVar7[-3] = '\0';
              pcVar7[-2] = '\0';
              pcVar7[-1] = '\0';
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x2aa);
              kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
              if (local_32 != local_31[0]) {
                pcVar7[-8] = -0x6e;
                pcVar7[-7] = '0';
                pcVar7[-6] = '\x10';
                pcVar7[-5] = '\0';
                pcVar7[-4] = '\0';
                pcVar7[-3] = '\0';
                pcVar7[-2] = '\0';
                pcVar7[-1] = '\0';
                __assert_fail("v_out == v",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0x2aa,"void kv_copy_var_nentry_test(btree_kv_ops *)");
              }
            }
            local_31[0] = local_32 + '\x01';
            lVar10 = lVar10 + 1;
          } while( true );
        }
        p_Var2 = kv_ops->get_kv;
        pcVar7[-8] = -0x19;
        pcVar7[-7] = '.';
        pcVar7[-6] = '\x10';
        pcVar7[-5] = '\0';
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        (*p_Var2)(__ptr_00,(short)lVar10 + 5,p_Var1,&local_32);
        pcVar8 = (char *)auStack_c0[lVar10 + 3];
        pcVar7[-8] = -6;
        pcVar7[-7] = '.';
        pcVar7[-6] = '\x10';
        pcVar7[-5] = '\0';
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        iVar6 = strcmp((char *)p_Var1,pcVar8);
        if (iVar6 != 0) {
          builtin_strncpy(pcVar7 + -8,"4/\x10",4);
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                 );
          kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
          builtin_strncpy(pcVar7 + -8,"F/\x10",4);
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          iVar6 = strcmp((char *)p_Var1,pcVar8);
          if (iVar6 != 0) {
            builtin_strncpy(pcVar7 + -8,"&1\x10",4);
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            __assert_fail("!(strcmp(k_out, key[idx - n/2]))",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0x29a,"void kv_copy_var_nentry_test(btree_kv_ops *)");
          }
        }
        if (local_32 != local_31[0]) {
          builtin_strncpy(pcVar7 + -8,"s/\x10",4);
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                 );
          kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
          if (local_32 != local_31[0]) {
            pcVar7[-8] = -0x5f;
            pcVar7[-7] = '/';
            pcVar7[-6] = '\x10';
            pcVar7[-5] = '\0';
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            __assert_fail("v_out == v",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0x29b,"void kv_copy_var_nentry_test(btree_kv_ops *)");
          }
        }
        local_31[0] = local_32 + '\x01';
        lVar10 = lVar10 + 1;
      } while( true );
    }
    p_Var2 = kv_ops->get_kv;
    pcVar7[-8] = -0xb;
    pcVar7[-7] = '-';
    pcVar7[-6] = '\x10';
    pcVar7[-5] = '\0';
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    (*p_Var2)(__ptr_00,(idx_t)lVar10,p_Var1,&local_32);
    pcVar8 = (char *)auStack_c0[lVar10 + 8];
    builtin_strncpy(pcVar7 + -8,"\x05.\x10",4);
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    iVar6 = strcmp((char *)p_Var1,pcVar8);
    if (iVar6 != 0) {
      builtin_strncpy(pcVar7 + -8,"?.\x10",4);
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
             );
      kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
      builtin_strncpy(pcVar7 + -8,"Q.\x10",4);
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      iVar6 = strcmp((char *)p_Var1,pcVar8);
      if (iVar6 != 0) {
        builtin_strncpy(pcVar7 + -8,"\a1\x10",4);
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        __assert_fail("!(strcmp(k_out, key[idx + n/2]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x28a,"void kv_copy_var_nentry_test(btree_kv_ops *)");
      }
    }
    if (local_32 != local_31[0]) {
      builtin_strncpy(pcVar7 + -8,"~.\x10",4);
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
             );
      kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
      if (local_32 != local_31[0]) {
        pcVar7[-8] = -0x54;
        pcVar7[-7] = '.';
        pcVar7[-6] = '\x10';
        pcVar7[-5] = '\0';
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        __assert_fail("v_out == v",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x28b,"void kv_copy_var_nentry_test(btree_kv_ops *)");
      }
    }
    local_31[0] = local_32 + '\x01';
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node, node_dst;
    uint8_t v, v_out;
    idx_t idx, src_idx, dst_idx, len;
    int n=10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    // set n items into source node
    for (idx = 0; idx < n; idx++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // copy n/2 entries into dest node
    src_idx = n/2;
    dst_idx = 0;
    len = src_idx;
    node_dst = dummy_node(ksize, vsize, 1);
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, len);

    // verify
    v = 100 + n/2;
    for (idx = 0; idx < n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx + n/2])));
        TEST_CHK(v_out == v);
        v++;

    }

    // append n entries into dst node
    dst_idx = src_idx;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = n/2; idx < n+n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx - n/2])));
        TEST_CHK(v_out == v);
        v++;
    }

    // prepend n entries into dst node
    dst_idx = 0;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = src_idx; idx < n; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node); free(node_dst);

    memleak_end();
    TEST_RESULT("kv_copy_var_nentry_test");
}